

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cpp
# Opt level: O3

BOOL IsInDebugBreak(void *addr)

{
  return (BOOL)(addr < (undefined *)0x350e37 && &RtlRestoreContext_End < addr);
}

Assistant:

BOOL
IsInDebugBreak(void *addr)
{
#ifdef _M_IX86
    // TODO: enable this
    // When enabled, lldb/ch fails prematurely at initialization phase
    return FALSE;
#else
    return (addr >= (void *)DBG_DebugBreak) && (addr <= (void *)DBG_DebugBreak_End);
#endif
}